

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zel_basic_leak_checker.cpp
# Opt level: O1

void __thiscall validation_layer::basic_leakChecker::~basic_leakChecker(basic_leakChecker *this)

{
  if (this->enablebasic_leak == true) {
    if (basic_leak_checker != (long *)0x0) {
      (**(code **)(*basic_leak_checker + 0xcb8))();
    }
    if (DAT_00201568 != (long *)0x0) {
      (**(code **)(*DAT_00201568 + 0x458))();
    }
    if (DAT_00201560 != (long *)0x0) {
      (**(code **)(*DAT_00201560 + 0x958))();
      return;
    }
  }
  return;
}

Assistant:

basic_leakChecker::~basic_leakChecker() {
        if(enablebasic_leak) {
            delete basic_leak_checker.zeValidation;
            delete basic_leak_checker.zetValidation;
            delete basic_leak_checker.zesValidation;
        }
    }